

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O3

HPDF_EmbeddedFile HPDF_AttachFile(HPDF_Doc pdf,char *file)

{
  HPDF_BOOL HVar1;
  HPDF_NameDict dict;
  HPDF_NameTree ntree;
  HPDF_EmbeddedFile obj;
  HPDF_String name;
  HPDF_STATUS HVar2;
  HPDF_Array array;
  HPDF_PDFVer HVar3;
  
  HVar1 = HPDF_HasDoc(pdf);
  if ((HVar1 != 0) &&
     ((dict = HPDF_Catalog_GetNames(pdf->catalog), dict != (HPDF_NameDict)0x0 ||
      ((dict = HPDF_NameDict_New(pdf->mmgr,pdf->xref), dict != (HPDF_NameDict)0x0 &&
       (HVar2 = HPDF_Catalog_SetNames(pdf->catalog,dict), HVar2 == 0)))))) {
    ntree = HPDF_NameDict_GetNameTree(dict,HPDF_NAME_EMBEDDED_FILES);
    if (ntree == (HPDF_NameTree)0x0) {
      ntree = HPDF_NameTree_New(pdf->mmgr,pdf->xref);
      if (ntree == (HPDF_NameTree)0x0) {
        return (HPDF_EmbeddedFile)0x0;
      }
      HVar2 = HPDF_NameDict_SetNameTree(dict,HPDF_NAME_EMBEDDED_FILES,ntree);
      if (HVar2 != 0) {
        return (HPDF_EmbeddedFile)0x0;
      }
    }
    obj = HPDF_EmbeddedFile_New(pdf->mmgr,pdf->xref,file);
    if (obj != (HPDF_EmbeddedFile)0x0) {
      name = HPDF_String_New(pdf->mmgr,file,(HPDF_Encoder_conflict)0x0);
      if (name == (HPDF_String)0x0) {
        return (HPDF_EmbeddedFile)0x0;
      }
      HVar2 = HPDF_NameTree_Add(ntree,name,obj);
      if (HVar2 == 0) {
        array = (HPDF_Array)HPDF_Dict_GetItem(pdf->catalog,"AF",0x10);
        if (array == (HPDF_Array)0x0) {
          array = HPDF_Array_New(pdf->mmgr);
          if (array == (HPDF_Array)0x0) {
            return (HPDF_EmbeddedFile)0x0;
          }
          HPDF_Dict_Add(pdf->catalog,"AF",array);
        }
        HPDF_Array_Add(array,obj);
        HVar3 = HPDF_VER_17;
        if (HPDF_VER_17 < pdf->pdf_version) {
          HVar3 = pdf->pdf_version;
        }
        pdf->pdf_version = HVar3;
        return obj;
      }
    }
  }
  return (HPDF_EmbeddedFile)0x0;
}

Assistant:

HPDF_EXPORT(HPDF_EmbeddedFile)
HPDF_AttachFile  (HPDF_Doc    pdf,
                  const char *file)
{
    HPDF_NameDict names;
    HPDF_NameTree ntree;
    HPDF_EmbeddedFile efile;
    HPDF_String name;
    HPDF_Array af;
    HPDF_STATUS ret = HPDF_OK;

    HPDF_PTRACE ((" HPDF_AttachFile\n"));

    if (!HPDF_HasDoc (pdf))
        return NULL;

    names = HPDF_Catalog_GetNames (pdf->catalog);
    if (!names) {
        names = HPDF_NameDict_New (pdf->mmgr, pdf->xref);
        if (!names)
            return NULL;

        ret = HPDF_Catalog_SetNames (pdf->catalog, names);
        if (ret != HPDF_OK)
            return NULL;
    }

    ntree = HPDF_NameDict_GetNameTree (names, HPDF_NAME_EMBEDDED_FILES);
    if (!ntree) {
        ntree = HPDF_NameTree_New (pdf->mmgr, pdf->xref);
        if (!ntree)
            return NULL;

        ret = HPDF_NameDict_SetNameTree (names, HPDF_NAME_EMBEDDED_FILES, ntree);
        if (ret != HPDF_OK)
            return NULL;
    }

    efile = HPDF_EmbeddedFile_New (pdf->mmgr, pdf->xref, file);
    if (!efile)
        return NULL;

    name = HPDF_String_New (pdf->mmgr, file, NULL);
    if (!name)
        return NULL;

    ret = HPDF_NameTree_Add (ntree, name, efile);
    if (ret != HPDF_OK)
        return NULL;

    af = HPDF_Dict_GetItem(pdf->catalog, "AF", HPDF_OCLASS_ARRAY);
    if (!af) {
        af = HPDF_Array_New(pdf->mmgr);
        if (!af)
            return NULL;
        HPDF_Dict_Add(pdf->catalog, "AF", af);
    }
    HPDF_Array_Add(af, efile);

    pdf->pdf_version = (pdf->pdf_version > HPDF_VER_17 ? pdf->pdf_version : HPDF_VER_17);
    return efile;
}